

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O3

bool __thiscall EthUdpPort::SetMulticastIP(EthUdpPort *this,string *multicast)

{
  SocketInternals *pSVar1;
  uint in_EAX;
  unsigned_long ret;
  in_addr local_28 [2];
  
  pSVar1 = this->sockPtr;
  if ((pSVar1 != (SocketInternals *)0x0) &&
     (local_28[0].s_addr = in_EAX, inet_pton(2,(multicast->_M_dataplus)._M_p,local_28),
     (local_28[0].s_addr & 0xf0) == 0xe0)) {
    (pSVar1->ServerAddrBroadcast).sin_addr.s_addr = local_28[0].s_addr;
    std::__cxx11::string::_M_assign((string *)&this->MulticastIP);
    return true;
  }
  return false;
}

Assistant:

bool EthUdpPort::SetMulticastIP(const std::string &multicast)
{
    if (!sockPtr)
        return false;
    bool ret = sockPtr->SetMulticastIP(multicast);
    if (ret)
        MulticastIP = multicast;
    return ret;
}